

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderConstExprTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::ShaderConstExprTests::init(ShaderConstExprTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *testCtx;
  int extraout_EAX;
  RenderContext *renderCtx;
  ContextInfo *contextInfo;
  size_type sVar1;
  const_reference ppTVar2;
  TestNode *node;
  int local_50;
  int i;
  ShaderLibrary local_40;
  undefined1 local_28 [8];
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children;
  ShaderConstExprTests *this_local;
  
  testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  renderCtx = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  contextInfo = gles3::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  deqp::gls::ShaderLibrary::ShaderLibrary(&local_40,testCtx,renderCtx,contextInfo);
  deqp::gls::ShaderLibrary::loadShaderFile
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_28,&local_40,
             "shaders/constant_expressions.test");
  deqp::gls::ShaderLibrary::~ShaderLibrary(&local_40);
  local_50 = 0;
  while( true ) {
    sVar1 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::size
                      ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_28);
    if ((int)sVar1 <= local_50) break;
    ppTVar2 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::operator[]
                        ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_28,
                         (long)local_50);
    tcu::TestNode::addChild((TestNode *)this,*ppTVar2);
    local_50 = local_50 + 1;
  }
  node = (TestNode *)operator_new(0x78);
  ShaderConstExprBuiltinTests::ShaderConstExprBuiltinTests
            ((ShaderConstExprBuiltinTests *)node,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,node);
  std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~vector
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_28);
  return extraout_EAX;
}

Assistant:

void ShaderConstExprTests::init (void)
{
	const std::vector<tcu::TestNode*> children = gls::ShaderLibrary(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo()).loadShaderFile("shaders/constant_expressions.test");

	for (int i = 0; i < (int)children.size(); i++)
		addChild(children[i]);

	addChild(new ShaderConstExprBuiltinTests(m_context));
}